

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O1

void __thiscall
dynet::PickElement::backward_dev_impl<dynet::Device_CPU>
          (PickElement *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  float *pfVar2;
  DefaultDevice *device;
  bool bVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  invalid_argument *this_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  type *ptVar10;
  type *ptVar11;
  uint uVar12;
  long lVar13;
  Device_CPU *pDVar14;
  byte bVar15;
  ostringstream oss;
  TensorAssignOp<Eigen::TensorChippingOp<_1L,_Eigen::TensorChippingOp<3L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<_1L,_Eigen::TensorChippingOp<3L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>_>,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
  local_210;
  type local_200;
  Device_CPU *local_1b8;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *local_1b0;
  undefined1 local_1a8 [56];
  float *local_170;
  DimensionId<_1L> local_168;
  StoragePointerType local_160;
  ulong local_158;
  long local_150;
  long local_148;
  ulong local_140;
  
  bVar15 = 0;
  local_1b0 = xs;
  if (i != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed dimension check in PickElement::backward",0x2f);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this_00,(string *)&local_200);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (this->pval == (uint *)0x0) {
    pvVar4 = this->pvals;
    if ((pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish ==
        (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      return;
    }
    local_1b8 = dev;
    uVar6 = 0;
    uVar7 = 1;
    do {
      pDVar14 = local_1b8;
      if (((*(local_1b0->
             super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
             _M_impl.super__Vector_impl_data._M_start)->d).bd == 1) {
        uVar1 = (dEdf->d).nd;
        if (uVar1 == 2) {
          uVar9 = (dEdf->d).d[0];
          local_168.actual_dim = (DenseIndex)(int)(dEdf->d).d[1];
        }
        else {
          uVar9 = 1;
          if (uVar1 != 0) {
            uVar9 = (dEdf->d).d[0];
          }
          local_168.actual_dim = 1;
        }
        uVar1 = (dEdxi->d).nd;
        if (uVar1 == 2) {
          uVar12 = 1;
          if (1 < uVar1) {
            uVar12 = (dEdxi->d).d[1];
          }
          uVar8 = (dEdxi->d).d[0];
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1] = (long)(int)uVar12;
LAB_003efe29:
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[2] = 1;
        }
        else {
          if (uVar1 != 3) {
            uVar8 = 1;
            if (uVar1 != 0) {
              uVar8 = (dEdxi->d).d[0];
            }
            local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1] = 1;
            goto LAB_003efe29;
          }
          uVar8 = (dEdxi->d).d[0];
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1] =
               (long)(int)(dEdxi->d).d[1];
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[2] =
               (long)(int)(dEdxi->d).d[2];
        }
        local_160 = (StoragePointerType)(long)(int)(dEdf->d).bd;
        local_1a8._48_8_ = dEdf->v;
        local_200.m_xpr.m_xpr.m_data = dEdxi->v;
        local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[3] =
             (long)(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start[uVar6];
        local_200.m_xpr.m_offset = (Index)this->dimension;
        local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[0] = (long)(int)uVar8;
        local_170 = (float *)(long)(int)uVar9;
        local_210.m_lhs_xpr = &local_200;
        local_210.m_rhs_xpr = (type *)local_1a8;
        local_1a8._0_8_ = local_200.m_xpr.m_xpr.m_data;
        local_1a8._8_8_ = local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[0];
        local_1a8._16_8_ = local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1];
        local_1a8._24_8_ = local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[2];
        local_1a8._32_8_ = local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[3];
        local_1a8._40_8_ = local_200.m_xpr.m_offset;
        local_158 = uVar6;
        Eigen::internal::
        TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<-1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<-1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
        ::run((TensorAssignOp<Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
               *)&local_210,dev->edevice);
        pDVar14 = dev;
      }
      else {
        uVar1 = (dEdf->d).nd;
        if (uVar1 == 2) {
          uVar9 = (dEdf->d).d[0];
          lVar13 = (long)(int)(dEdf->d).d[1];
        }
        else {
          uVar9 = 1;
          if (uVar1 != 0) {
            uVar9 = (dEdf->d).d[0];
          }
          lVar13 = 1;
        }
        uVar1 = (dEdxi->d).nd;
        if (uVar1 == 2) {
          uVar12 = 1;
          if (1 < uVar1) {
            uVar12 = (dEdxi->d).d[1];
          }
          uVar8 = (dEdxi->d).d[0];
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1] = (long)(int)uVar12;
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[2] = 1;
        }
        else if (uVar1 == 3) {
          uVar8 = (dEdxi->d).d[0];
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1] =
               (long)(int)(dEdxi->d).d[1];
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[2] =
               (long)(int)(dEdxi->d).d[2];
        }
        else {
          uVar8 = 1;
          if (uVar1 != 0) {
            uVar8 = (dEdxi->d).d[0];
          }
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[2] = 1;
          local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1] = 1;
        }
        pfVar2 = dEdf->v;
        uVar1 = (dEdf->d).bd;
        local_200.m_xpr.m_xpr.m_data = dEdxi->v;
        local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[0] = (long)(int)uVar8;
        local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[3] =
             (long)(int)(dEdxi->d).bd;
        local_200.m_xpr.m_offset = uVar6;
        local_200.m_offset =
             (ulong)(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar6];
        local_200.m_dim.actual_dim = (ulong)this->dimension;
        device = local_1b8->edevice;
        local_210.m_rhs_xpr = (type *)local_1a8;
        local_210.m_lhs_xpr = &local_200;
        ptVar10 = local_210.m_lhs_xpr;
        ptVar11 = local_210.m_rhs_xpr;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          (ptVar11->m_lhs_xpr).m_xpr.m_xpr.m_data = (ptVar10->m_xpr).m_xpr.m_data;
          ptVar10 = (type *)((long)ptVar10 + (ulong)bVar15 * -0x10 + 8);
          ptVar11 = (type *)((long)ptVar11 + (ulong)bVar15 * -0x10 + 8);
        }
        local_158 = (ulong)(int)uVar9;
        local_160 = pfVar2;
        local_150 = lVar13;
        local_148 = (long)(int)uVar1;
        local_140 = uVar6;
        Eigen::internal::
        TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<-1L,_Eigen::TensorChippingOp<3L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<-1L,_Eigen::TensorChippingOp<3L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>_>,_const_Eigen::TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
        ::run(&local_210,device);
      }
      pvVar4 = this->pvals;
      bVar3 = (ulong)((long)(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar7;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
      dev = pDVar14;
      if (bVar3) {
        return;
      }
    } while( true );
  }
  uVar1 = (dEdf->d).nd;
  if (uVar1 == 2) {
    uVar9 = (dEdf->d).d[0];
    local_160 = (StoragePointerType)(long)(int)(dEdf->d).d[1];
  }
  else {
    uVar9 = 1;
    if (uVar1 != 0) {
      uVar9 = (dEdf->d).d[0];
    }
    local_160 = (StoragePointerType)0x1;
  }
  local_158 = (ulong)(int)(dEdf->d).bd;
  local_168.actual_dim = (DenseIndex)(int)uVar9;
  local_170 = dEdf->v;
  uVar1 = (dEdxi->d).nd;
  if (uVar1 == 2) {
    uVar9 = 1;
    if (1 < uVar1) {
      uVar9 = (dEdxi->d).d[1];
    }
    uVar12 = (dEdxi->d).d[0];
    local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1] = (long)(int)uVar9;
  }
  else {
    if (uVar1 == 3) {
      uVar12 = (dEdxi->d).d[0];
      local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1] =
           (long)(int)(dEdxi->d).d[1];
      local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[2] =
           (long)(int)(dEdxi->d).d[2];
      goto LAB_003f007f;
    }
    uVar12 = 1;
    if (uVar1 != 0) {
      uVar12 = (dEdxi->d).d[0];
    }
    local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1] = 1;
  }
  local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[2] = 1;
LAB_003f007f:
  local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[3] = (long)(int)(dEdxi->d).bd;
  local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[0] = (long)(int)uVar12;
  local_200.m_xpr.m_xpr.m_data = dEdxi->v;
  local_200.m_xpr.m_offset = (Index)*this->pval;
  local_200.m_xpr._48_8_ = ZEXT48(this->dimension);
  local_210.m_lhs_xpr = &local_200;
  local_210.m_rhs_xpr = (type *)local_1a8;
  local_1a8._0_8_ = local_200.m_xpr.m_xpr.m_data;
  local_1a8._8_8_ = local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[0];
  local_1a8._16_8_ = local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[1];
  local_1a8._24_8_ = local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[2];
  local_1a8._32_8_ = local_200.m_xpr.m_xpr.m_dimensions.super_array<long,_4>._M_elems[3];
  local_1a8._40_8_ = local_200.m_xpr.m_offset;
  local_1a8._48_8_ = local_200.m_xpr._48_8_;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<-1L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<-1L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
  ::run((TensorAssignOp<Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>
         *)&local_210,dev->edevice);
  return;
}

Assistant:

void PickElement::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  DYNET_ARG_CHECK(i == 0, "Failed dimension check in PickElement::backward");
  if(pval) {
    dEdxi.tb<3>().chip(*pval, dimension).device(*dev.edevice) += dEdf.tb<2>();
  } else {
    DYNET_ASSERT(pvals, "Neither single nor vector of elements available in PickElement::forward");
    for(unsigned b = 0; b < pvals->size(); ++b){
      if(xs[0]->d.bd == 1){
        dEdxi.t<3>().chip((*pvals)[b], dimension).device(*dev.edevice) += dEdf.tb<2>().chip<2>(b);
      }else{
        dEdxi.tb<3>().chip<3>(b).chip((*pvals)[b], dimension).device(*dev.edevice) += dEdf.tb<2>().chip<2>(b);
      }
    }
  }
}